

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O3

int __thiscall Pyraminx::count_correct_edge(Pyraminx *this)

{
  Face *this_00;
  Pyraminx *pPVar1;
  Color CVar2;
  Color CVar3;
  Color CVar4;
  Color CVar5;
  uint uVar6;
  int iVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  int i;
  int iVar8;
  uint uVar9;
  Corner ref_corner;
  shared_ptr<Face> adjacent_face;
  shared_ptr<Face> current_face;
  Face *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  Face *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_50;
  Pyraminx *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_60 = (this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58._M_pi =
       (this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
    }
  }
  local_38 = &(this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  iVar7 = 0;
  iVar8 = 3;
  local_48 = this;
  do {
    this_00 = (local_60->neighbors).U_neighbor_right.
              super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    a_Stack_70[0]._M_pi =
         (local_60->neighbors).U_neighbor_right.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (a_Stack_70[0]._M_pi)->_M_use_count = (a_Stack_70[0]._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (a_Stack_70[0]._M_pi)->_M_use_count = (a_Stack_70[0]._M_pi)->_M_use_count + 1;
      }
    }
    CVar2 = Face::get_triangle_color(local_60,U,1,2);
    CVar3 = Face::get_triangle_color(local_60,U,2,4);
    CVar4 = Face::get_triangle_color(this_00,U,1,0);
    local_50 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_50._4_4_,iVar8);
    CVar5 = Face::get_triangle_color(this_00,U,2,0);
    uVar6 = 0;
    uVar9 = 0;
    if (CVar2 == local_60->center_color) {
      uVar9 = (uint)(CVar4 == this_00->center_color);
    }
    if (CVar3 == local_60->center_color) {
      uVar6 = (uint)(CVar5 == this_00->center_color);
    }
    local_60 = this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_58,a_Stack_70);
    iVar8 = (int)local_50;
    if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_70[0]._M_pi);
    }
    iVar7 = iVar7 + uVar9 + uVar6;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  local_50 = &(local_48->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_40 = &(local_48->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  iVar8 = 0;
  do {
    pPVar1 = local_48;
    a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (iVar8 == 2) {
      local_78 = (local_48->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ref_corner = B;
      __r = local_38;
    }
    else if (iVar8 == 1) {
      local_78 = (local_48->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ref_corner = R;
      __r = local_50;
    }
    else {
      local_78 = (local_48->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ref_corner = L;
      __r = local_40;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_70,__r);
    CVar2 = Face::get_triangle_color
                      ((pPVar1->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,ref_corner,3,2);
    CVar3 = Face::get_triangle_color
                      ((pPVar1->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,ref_corner,3,4);
    CVar4 = Face::get_triangle_color(local_78,U,3,2);
    CVar5 = Face::get_triangle_color(local_78,U,3,4);
    uVar6 = 0;
    uVar9 = 0;
    if (CVar2 == green) {
      uVar9 = (uint)(CVar5 == local_78->center_color);
    }
    if (CVar3 == green) {
      uVar6 = (uint)(CVar4 == local_78->center_color);
    }
    if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_70[0]._M_pi);
    }
    iVar7 = iVar7 + uVar9 + uVar6;
    iVar8 = iVar8 + 1;
  } while (iVar8 != 3);
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  return iVar7;
}

Assistant:

int Pyraminx::count_correct_edge(){
    int count = 0;
    // Check the edges between faces sharing the upper corner
    std::shared_ptr<Face> current_face = blue_face;
    for(int i = 0; i < 3; i++){
        std::shared_ptr<Face> adjacent_face = current_face->neighbors.U_neighbor_right;
        Color current_top = current_face->get_triangle_color(Corner::U, 1, 2);
        Color current_bottom = current_face->get_triangle_color(Corner::U, 2, 4);
        Color adjacent_top = adjacent_face->get_triangle_color(Corner::U, 1, 0);
        Color adjacent_bottom = adjacent_face->get_triangle_color(Corner::U, 2, 0);
        int top_correct = (current_top == current_face->get_center_color()) 
            && (adjacent_top == adjacent_face->get_center_color());
        int bottom_correct = (current_bottom == current_face->get_center_color()) 
            && (adjacent_bottom == adjacent_face->get_center_color());
        count = count + top_correct + bottom_correct;
        current_face = adjacent_face;
    }
    // Check the edges between the bottom face (green) and the others
    for(int i = 0; i < 3; i++){
        std::shared_ptr<Face> adjacent_face;
        Corner current_corner;
        switch (i)
        {
        case 0:
            current_corner = Corner::L;
            adjacent_face = yellow_face;
            break;
        case 1:
            current_corner = Corner::R;
            adjacent_face = red_face;
            break;
        case 2:
            current_corner = Corner::B;
            adjacent_face = blue_face;
            break;
        }

        Color current_left  = green_face->get_triangle_color(current_corner, 3, 2);
        Color current_right = green_face->get_triangle_color(current_corner, 3, 4);

        Color adjacent_right = adjacent_face->get_triangle_color(Corner::U, 3, 2);
        Color adjacent_left = adjacent_face->get_triangle_color(Corner::U, 3, 4);

        int left_correct = (current_left == Color::green) && (adjacent_left == adjacent_face->get_center_color());
        int right_correct = (current_right == Color::green) && (adjacent_right == adjacent_face->get_center_color());

        count = count + left_correct + right_correct;
    }
    //printf("Correct edge pieces: %i/12\n", count);
    return count;
}